

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness_sim.c
# Opt level: O2

int Abc_CommandAbcLivenessToSafetySim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  FILE *__s;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAig;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Man_t *p;
  char *pcVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  Abc_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  Aig_Obj_t *pAVar13;
  Aig_Obj_t *pAVar14;
  Aig_Obj_t *pAVar15;
  size_t sVar16;
  char *pcVar17;
  Aig_Obj_t *pAVar18;
  void *pvVar19;
  Aig_Obj_t *pAVar20;
  Aig_Obj_t *pAVar21;
  Nm_Man_t *pNVar22;
  int iVar23;
  int iVar24;
  int i;
  Aig_Obj_t *local_88;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __s = (FILE *)Abc_FrameReadErr(pAbc);
  if (pAVar4 == (Abc_Ntk_t *)0x0) {
    fwrite("Empty network.\n",0xf,1,__s);
    return 1;
  }
  pNtk = pAVar4;
  if (pAVar4->ntkType != ABC_NTK_STRASH) {
    puts("\nThe input network was not strashed, strashing....");
    pNtk = Abc_NtkStrash(pAVar4,0,0,0);
  }
  pAig = Abc_NtkToDar(pNtk,0,1);
  pVVar5 = populateLivenessVector(pAVar4,pAig);
  pVVar6 = populateFairnessVector(pAVar4,pAig);
  iVar3 = Extra_UtilGetopt(argc,argv,"1");
  vecPis = Vec_PtrAlloc(pAig->nTruePis + 1);
  vecPiNames = Vec_PtrAlloc(pAig->nTruePis + 1);
  vecLos = Vec_PtrAlloc(pVVar6->nSize + pAig->nRegs * 2 + pVVar5->nSize + 1);
  vecLoNames = Vec_PtrAlloc(pVVar6->nSize + pAig->nRegs * 2 + pVVar5->nSize + 1);
  p = Aig_ManStart(pAig->vObjs->nSize * 2);
  pcVar7 = Abc_UtilStrsav("live2safe");
  p->pSpec = (char *)0x0;
  p->pName = pcVar7;
  pAVar8 = pAig->pConst1;
  pAVar8->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (iVar3 != 0x31) {
    for (iVar3 = 0; iVar3 < pAig->nTruePis; iVar3 = iVar3 + 1) {
      pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar3);
      pAVar9 = Aig_ObjCreateCi(p);
      (pAVar8->field_5).pData = pAVar9;
      Vec_PtrPush(vecPis,pAVar9);
      pAVar10 = Abc_NtkPi(pAVar4,iVar3);
      pcVar7 = Abc_ObjName(pAVar10);
      pcVar7 = Abc_UtilStrsav(pcVar7);
      Vec_PtrPush(vecPiNames,pcVar7);
    }
    pAVar9 = Aig_ObjCreateCi(p);
    pcVar7 = Abc_UtilStrsav("SAVE_BIERE");
    Vec_PtrPush(vecPiNames,pcVar7);
    for (iVar3 = 0; iVar3 < pAig->nRegs; iVar3 = iVar3 + 1) {
      pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar3);
      pAVar11 = Aig_ObjCreateCi(p);
      (pAVar8->field_5).pData = pAVar11;
      Vec_PtrPush(vecLos,pAVar11);
      pAVar10 = Abc_NtkCi(pAVar4,pAVar4->vPis->nSize + iVar3);
      pcVar7 = Abc_ObjName(pAVar10);
      pcVar7 = Abc_UtilStrsav(pcVar7);
      Vec_PtrPush(vecLoNames,pcVar7);
    }
    pAVar11 = Aig_ObjCreateCi(p);
    Vec_PtrPush(vecLos,pAVar11);
    pcVar7 = Abc_UtilStrsav("SAVED_LO");
    Vec_PtrPush(vecLoNames,pcVar7);
    pAVar12 = Aig_Or(p,pAVar9,pAVar11);
    for (iVar3 = 0; iVar3 < pAig->vObjs->nSize; iVar3 = iVar3 + 1) {
      pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar3);
      if ((pAVar8 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar8->field_0x18 & 7) - 7)) {
        pAVar14 = Aig_ObjChild0Copy(pAVar8);
        pAVar13 = Aig_ObjChild1Copy(pAVar8);
        pAVar14 = Aig_And(p,pAVar14,pAVar13);
        (pAVar8->field_5).pData = pAVar14;
      }
    }
    pAVar8 = Aig_ObjCreateCo(p,*(Aig_Obj_t **)(((ulong)pAVar8->pFanin0 & 0xfffffffffffffffe) + 0x28)
                            );
    for (iVar3 = 0; iVar3 < pAig->nRegs; iVar3 = iVar3 + 1) {
      pAVar14 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar3);
      pAVar14 = Saig_ObjLoToLi(pAig,pAVar14);
      Aig_ObjCreateCo(p,(Aig_Obj_t *)
                        ((ulong)((uint)pAVar14->pFanin0 & 1) ^
                        *(ulong *)(((ulong)pAVar14->pFanin0 & 0xfffffffffffffffe) + 0x28)));
    }
    pAVar13 = Aig_ObjCreateCo(p,pAVar12);
    pAVar14 = (Aig_Obj_t *)0x0;
    for (iVar24 = 0; iVar3 = iVar3 + 1, iVar24 < pAig->nRegs; iVar24 = iVar24 + 1) {
      pvVar19 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar24);
      pAVar15 = Aig_ObjCreateCi(p);
      Vec_PtrPush(vecLos,pAVar15);
      pAVar10 = Abc_NtkCi(pAVar4,pAVar4->vPis->nSize + iVar24);
      pcVar7 = Abc_ObjName(pAVar10);
      sVar16 = strlen(pcVar7);
      pcVar7 = (char *)malloc(sVar16 + 10);
      pAVar10 = Abc_NtkCi(pAVar4,pAVar4->vPis->nSize + iVar24);
      pcVar17 = Abc_ObjName(pAVar10);
      sprintf(pcVar7,"%s__%s",pcVar17,"SHADOW");
      Vec_PtrPush(vecLoNames,pcVar7);
      pAVar18 = Aig_Mux(p,pAVar9,*(Aig_Obj_t **)((long)pvVar19 + 0x28),pAVar15);
      Aig_ObjCreateCo(p,pAVar18);
      pAVar15 = Aig_Exor(p,*(Aig_Obj_t **)((long)pvVar19 + 0x28),pAVar15);
      pAVar15 = (Aig_Obj_t *)((ulong)pAVar15 ^ 1);
      if (pAVar14 != (Aig_Obj_t *)0x0) {
        pAVar15 = Aig_And(p,pAVar15,pAVar14);
      }
      pAVar14 = pAVar15;
    }
    pAVar14 = Aig_And(p,pAVar11,pAVar14);
    if ((pVVar5 == (Vec_Ptr_t *)0x0) || (iVar24 = pVVar5->nSize, iVar24 == 0)) {
      puts("\nCircuit without any liveness property");
      iVar23 = 0;
LAB_0050cf58:
      local_88 = p->pConst1;
    }
    else {
      local_88 = (Aig_Obj_t *)0x0;
      for (iVar23 = 0; iVar23 < iVar24; iVar23 = iVar23 + 1) {
        pAVar18 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,iVar23);
        pAVar15 = pAVar18->pFanin0;
        uVar2 = *(ulong *)(((ulong)pAVar15 & 0xfffffffffffffffe) + 0x28);
        pAVar20 = Aig_ObjCreateCi(p);
        Vec_PtrPush(vecLos,pAVar20);
        iVar24 = getPoIndex(pAig,pAVar18);
        pAVar10 = Abc_NtkPo(pAVar4,iVar24);
        pcVar7 = Abc_ObjName(pAVar10);
        sVar16 = strlen(pcVar7);
        pcVar7 = (char *)malloc(sVar16 + 0xc);
        iVar24 = getPoIndex(pAig,pAVar18);
        pAVar10 = Abc_NtkPo(pAVar4,iVar24);
        pcVar17 = Abc_ObjName(pAVar10);
        sprintf(pcVar7,"%s__%s",pcVar17,"LIVENESS");
        Vec_PtrPush(vecLoNames,pcVar7);
        pAVar18 = Aig_Mux(p,pAVar9,(Aig_Obj_t *)((ulong)p->pConst1 ^ 1),pAVar20);
        pAVar15 = Aig_And(p,(Aig_Obj_t *)((uint)pAVar15 & 1 ^ uVar2),pAVar12);
        pAVar15 = Aig_Or(p,pAVar18,pAVar15);
        Aig_ObjCreateCo(p,pAVar15);
        if (local_88 != (Aig_Obj_t *)0x0) {
          pAVar20 = Aig_And(p,pAVar20,local_88);
        }
        iVar24 = pVVar5->nSize;
        iVar3 = iVar3 + 1;
        local_88 = pAVar20;
      }
      if (local_88 == (Aig_Obj_t *)0x0) goto LAB_0050cf58;
    }
    if ((pVVar6 == (Vec_Ptr_t *)0x0) || (iVar24 = pVVar6->nSize, iVar24 == 0)) {
      puts("\nCircuit without any fairness property");
      i = 0;
LAB_0050d162:
      pAVar15 = p->pConst1;
    }
    else {
      pAVar15 = (Aig_Obj_t *)0x0;
      for (i = 0; i < iVar24; i = i + 1) {
        pAVar21 = (Aig_Obj_t *)Vec_PtrEntry(pVVar6,i);
        pAVar18 = pAVar21->pFanin0;
        uVar2 = *(ulong *)(((ulong)pAVar18 & 0xfffffffffffffffe) + 0x28);
        pAVar20 = Aig_ObjCreateCi(p);
        Vec_PtrPush(vecLos,pAVar20);
        iVar24 = getPoIndex(pAig,pAVar21);
        pAVar10 = Abc_NtkPo(pAVar4,iVar24);
        pcVar7 = Abc_ObjName(pAVar10);
        sVar16 = strlen(pcVar7);
        pcVar7 = (char *)malloc(sVar16 + 0xc);
        iVar24 = getPoIndex(pAig,pAVar21);
        pAVar10 = Abc_NtkPo(pAVar4,iVar24);
        pcVar17 = Abc_ObjName(pAVar10);
        sprintf(pcVar7,"%s__%s",pcVar17,"FAIRNESS");
        Vec_PtrPush(vecLoNames,pcVar7);
        pAVar21 = Aig_Mux(p,pAVar9,(Aig_Obj_t *)((ulong)p->pConst1 ^ 1),pAVar20);
        pAVar18 = Aig_And(p,(Aig_Obj_t *)((uint)pAVar18 & 1 ^ uVar2),pAVar12);
        pAVar18 = Aig_Or(p,pAVar21,pAVar18);
        Aig_ObjCreateCo(p,pAVar18);
        if (pAVar15 != (Aig_Obj_t *)0x0) {
          pAVar20 = Aig_And(p,pAVar20,pAVar15);
        }
        pAVar15 = pAVar20;
        iVar24 = pVVar6->nSize;
      }
      iVar3 = iVar3 + i;
      if (pAVar15 == (Aig_Obj_t *)0x0) goto LAB_0050d162;
    }
    pAVar9 = Aig_And(p,pAVar15,(Aig_Obj_t *)((ulong)local_88 ^ 1));
    pAVar9 = Aig_And(p,pAVar14,pAVar9);
    Aig_ObjPatchFanin0(p,pAVar8,pAVar9);
    Aig_ManSetRegNum(p,iVar3);
    Aig_ManCiCleanupBiere(p);
    Aig_ManCoCleanupBiere(p);
    Aig_ManCleanup(p);
    iVar3 = Aig_ManCheck(p);
    if (iVar3 == 0) {
      __assert_fail("Aig_ManCheck( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/liveness_sim.c"
                    ,0x1d3,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    pVVar5 = p->vCos;
    iVar3 = p->nTruePos;
    iVar24 = Aig_ObjCioId(pAVar11);
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,~pAig->nTruePis + iVar3 + iVar24);
    if (pAVar8 != pAVar13) {
      __assert_fail("(Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/liveness_sim.c"
                    ,0x1d6,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p->nTruePos != 1) {
      __assert_fail("Saig_ManPoNum( pNew ) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/liveness_sim.c"
                    ,0x1d7,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (pAig->nTruePis + 1 != p->nTruePis) {
      __assert_fail("Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/liveness_sim.c"
                    ,0x1d8,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p->nRegs != iVar23 + i + pAig->nRegs * 2 + 1) {
      __assert_fail("Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) * 2 + 1 + liveLatch + fairLatch",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/liveness_sim.c"
                    ,0x1d9,
                    "Aig_Man_t *LivenessToSafetyTransformationSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    goto LAB_0050d2e8;
  }
  for (iVar3 = 0; iVar3 < pAig->nTruePis; iVar3 = iVar3 + 1) {
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar3);
    pAVar9 = Aig_ObjCreateCi(p);
    (pAVar8->field_5).pData = pAVar9;
    Vec_PtrPush(vecPis,pAVar9);
    pAVar10 = Abc_NtkPi(pAVar4,iVar3);
    pcVar7 = Abc_ObjName(pAVar10);
    pcVar7 = Abc_UtilStrsav(pcVar7);
    Vec_PtrPush(vecPiNames,pcVar7);
  }
  pAVar9 = Aig_ObjCreateCi(p);
  Vec_PtrPush(vecPiNames,"SAVE_BIERE");
  for (iVar3 = 0; iVar3 < pAig->nRegs; iVar3 = iVar3 + 1) {
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar3);
    pAVar11 = Aig_ObjCreateCi(p);
    (pAVar8->field_5).pData = pAVar11;
    Vec_PtrPush(vecLos,pAVar11);
    pAVar10 = Abc_NtkCi(pAVar4,pAVar4->vPis->nSize + iVar3);
    pcVar7 = Abc_ObjName(pAVar10);
    pcVar7 = Abc_UtilStrsav(pcVar7);
    Vec_PtrPush(vecLoNames,pcVar7);
  }
  for (iVar3 = 0; iVar3 < pAig->vObjs->nSize; iVar3 = iVar3 + 1) {
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar3);
    if ((pAVar8 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar8->field_0x18 & 7) - 7)) {
      pAVar11 = Aig_ObjChild0Copy(pAVar8);
      pAVar12 = Aig_ObjChild1Copy(pAVar8);
      pAVar11 = Aig_And(p,pAVar11,pAVar12);
      (pAVar8->field_5).pData = pAVar11;
    }
  }
  pAVar8 = Aig_ObjCreateCo(p,*(Aig_Obj_t **)(((ulong)pAVar8->pFanin0 & 0xfffffffffffffffe) + 0x28));
  for (iVar3 = 0; iVar24 = pAig->nRegs, iVar3 < iVar24; iVar3 = iVar3 + 1) {
    pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar3);
    pAVar11 = Saig_ObjLoToLi(pAig,pAVar11);
    Aig_ObjCreateCo(p,(Aig_Obj_t *)
                      ((ulong)((uint)pAVar11->pFanin0 & 1) ^
                      *(ulong *)(((ulong)pAVar11->pFanin0 & 0xfffffffffffffffe) + 0x28)));
  }
  pAVar11 = (Aig_Obj_t *)0x0;
  for (iVar23 = 0; iVar23 < iVar24; iVar23 = iVar23 + 1) {
    pAVar12 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar23);
    pAVar14 = Saig_ObjLoToLi(pAig,pAVar12);
    pAVar12 = Aig_Exor(p,(Aig_Obj_t *)(pAVar12->field_5).pData,
                       (Aig_Obj_t *)
                       ((ulong)((uint)pAVar14->pFanin0 & 1) ^
                       *(ulong *)(((ulong)pAVar14->pFanin0 & 0xfffffffffffffffe) + 0x28)));
    pAVar12 = (Aig_Obj_t *)((ulong)pAVar12 ^ 1);
    if (pAVar11 != (Aig_Obj_t *)0x0) {
      pAVar12 = Aig_And(p,pAVar12,pAVar11);
    }
    iVar24 = pAig->nRegs;
    pAVar11 = pAVar12;
  }
  pAVar9 = Aig_And(p,pAVar9,pAVar11);
  if ((pVVar5 == (Vec_Ptr_t *)0x0) || (iVar24 = pVVar5->nSize, iVar24 == 0)) {
    puts("\nCircuit without any liveness property");
LAB_0050cf38:
    pAVar11 = p->pConst1;
  }
  else {
    pAVar11 = (Aig_Obj_t *)0x0;
    for (iVar23 = 0; iVar23 < iVar24; iVar23 = iVar23 + 1) {
      pvVar19 = Vec_PtrEntry(pVVar5,iVar23);
      pAVar12 = (Aig_Obj_t *)
                ((ulong)((uint)*(ulong *)((long)pvVar19 + 8) & 1) ^
                *(ulong *)((*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffe) + 0x28));
      if (pAVar11 != (Aig_Obj_t *)0x0) {
        pAVar12 = Aig_And(p,pAVar12,pAVar11);
      }
      iVar24 = pVVar5->nSize;
      pAVar11 = pAVar12;
    }
    if (pAVar11 == (Aig_Obj_t *)0x0) goto LAB_0050cf38;
  }
  if ((pVVar6 == (Vec_Ptr_t *)0x0) || (iVar24 = pVVar6->nSize, iVar24 == 0)) {
    puts("\nCircuit without any fairness property");
LAB_0050cfce:
    pAVar12 = p->pConst1;
  }
  else {
    pAVar12 = (Aig_Obj_t *)0x0;
    for (iVar23 = 0; iVar23 < iVar24; iVar23 = iVar23 + 1) {
      pvVar19 = Vec_PtrEntry(pVVar6,iVar23);
      pAVar14 = (Aig_Obj_t *)
                ((ulong)((uint)*(ulong *)((long)pvVar19 + 8) & 1) ^
                *(ulong *)((*(ulong *)((long)pvVar19 + 8) & 0xfffffffffffffffe) + 0x28));
      if (pAVar12 != (Aig_Obj_t *)0x0) {
        pAVar14 = Aig_And(p,pAVar14,pAVar12);
      }
      iVar24 = pVVar6->nSize;
      pAVar12 = pAVar14;
    }
    if (pAVar12 == (Aig_Obj_t *)0x0) goto LAB_0050cfce;
  }
  pAVar11 = Aig_And(p,pAVar12,(Aig_Obj_t *)((ulong)pAVar11 ^ 1));
  pAVar9 = Aig_And(p,pAVar9,pAVar11);
  Aig_ObjPatchFanin0(p,pAVar8,pAVar9);
  Aig_ManSetRegNum(p,iVar3);
  printf("\nSaig_ManPiNum = %d, Reg Num = %d, before everything, before Pi cleanup\n",
         (ulong)(uint)p->vCis->nSize,(ulong)(uint)p->nRegs);
  Aig_ManCiCleanupBiere(p);
  Aig_ManCoCleanupBiere(p);
  Aig_ManCleanup(p);
  iVar3 = Aig_ManCheck(p);
  if (iVar3 == 0) {
    __assert_fail("Aig_ManCheck( pNew )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/liveness_sim.c"
                  ,0x2b3,
                  "Aig_Man_t *LivenessToSafetyTransformationOneStepLoopSim(Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
LAB_0050d2e8:
  pAVar4 = Abc_NtkFromAigPhase(p);
  iVar3 = Abc_NtkCheck(pAVar4);
  if (iVar3 == 0) {
    fwrite("Abc_NtkCreateCone(): Network check has failed.\n",0x2f,1,_stdout);
  }
  pVVar6 = vecLoNames;
  pVVar5 = vecPiNames;
  pNVar22 = Nm_ManCreate(pAVar4->vCis->nSize);
  pAVar4->pManName = pNVar22;
  for (iVar3 = 0; iVar3 < p->nTruePis; iVar3 = iVar3 + 1) {
    pvVar19 = Vec_PtrEntry(p->vCis,iVar3);
    pAVar10 = Abc_NtkCi(pAVar4,iVar3);
    iVar24 = pAVar10->Id;
    pNVar22 = pAVar4->pManName;
    uVar1 = *(uint *)((long)pvVar19 + 0x18);
    pcVar7 = (char *)Vec_PtrEntry(pVVar5,iVar3);
    Nm_ManStoreIdName(pNVar22,iVar24,uVar1 & 7,pcVar7,(char *)0x0);
  }
  for (iVar3 = 0; iVar3 < p->nRegs; iVar3 = iVar3 + 1) {
    pvVar19 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar3);
    pAVar10 = Abc_NtkCi(pAVar4,p->nTruePis + iVar3);
    iVar24 = pAVar10->Id;
    pNVar22 = pAVar4->pManName;
    uVar1 = *(uint *)((long)pvVar19 + 0x18);
    pcVar7 = (char *)Vec_PtrEntry(pVVar6,iVar3);
    Nm_ManStoreIdName(pNVar22,iVar24,uVar1 & 7,pcVar7,(char *)0x0);
  }
  Abc_FrameSetCurrentNetwork(pAbc,pAVar4);
  return 0;
}

Assistant:

int Abc_CommandAbcLivenessToSafetySim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk, * pNtkTemp, *pNtkNew, *pNtkOld;
    Aig_Man_t * pAig, *pAigNew;
    int c;
    Vec_Ptr_t * vLive, * vFair;
                
    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        return 1;
    }

    if( !Abc_NtkIsStrash( pNtk ) )
    {
        printf("\nThe input network was not strashed, strashing....\n");
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkOld = pNtkTemp;
        pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
    }
    else
    {
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        pNtkOld = pNtk;
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
    }

#if 0
    Aig_ManPrintStats( pAig );
    printf("\nDetail statistics*************************************\n");
    printf("Number of true primary inputs = %d\n", Saig_ManPiNum( pAig ));
    printf("Number of true primary outputs = %d\n", Saig_ManPoNum( pAig ));
    printf("Number of true latch outputs = %d\n", Saig_ManCiNum( pAig ) - Saig_ManPiNum( pAig ));
    printf("Number of true latch inputs = %d\n", Saig_ManCoNum( pAig ) - Saig_ManPoNum( pAig ));
    printf("Numer of registers = %d\n", Saig_ManRegNum( pAig ) );
    printf("\n*******************************************************\n");
#endif

    c = Extra_UtilGetopt( argc, argv, "1" );
    if( c == '1' )
        pAigNew = LivenessToSafetyTransformationOneStepLoopSim( pNtk, pAig, vLive, vFair );
    else
        pAigNew = LivenessToSafetyTransformationSim( pNtk, pAig, vLive, vFair );
    
#if 0
    Aig_ManPrintStats( pAigNew );
    printf("\nDetail statistics*************************************\n");
    printf("Number of true primary inputs = %d\n", Saig_ManPiNum( pAigNew ));
    printf("Number of true primary outputs = %d\n", Saig_ManPoNum( pAigNew ));
    printf("Number of true latch outputs = %d\n", Saig_ManCiNum( pAigNew ) - Saig_ManPiNum( pAigNew ));
    printf("Number of true latch inputs = %d\n", Saig_ManCoNum( pAigNew ) - Saig_ManPoNum( pAigNew ));
    printf("Numer of registers = %d\n", Saig_ManRegNum( pAigNew ) );
    printf("\n*******************************************************\n");
#endif

    pNtkNew = Abc_NtkFromAigPhase( pAigNew );

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
    
    updateNewNetworkNameManager( pNtkNew, pAigNew, vecPiNames,vecLoNames );
    Abc_FrameSetCurrentNetwork( pAbc, pNtkNew );

    //Saig_ManForEachPi( pAigNew, pObj, i )
    //    printf("Name of %d-th Pi = %s\n", i, retrieveTruePiName( pNtk, pAig, pAigNew, pObj ) );

    //Saig_ManForEachLo( pAigNew, pObj, i )
    //    printf("Name of %d-th Lo = %s\n", i, retrieveLOName( pNtk, pAig, pAigNew, pObj, vLive, vFair ) );

    //printVecPtrOfString( vecPiNames );
    //printVecPtrOfString( vecLoNames );

#if 0
#ifndef DUPLICATE_CKT_DEBUG
    Saig_ManForEachPi( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecPiNames, i), retrieveTruePiName( pNtk, pAig, pAigNew, pObj ) ) == 0 );
        //printf("Name of %d-th Pi = %s, %s\n", i, retrieveTruePiName( pNtk, pAig, pAigNew, pObj ), (char *)Vec_PtrEntry(vecPiNames, i) );

    Saig_ManForEachLo( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecLoNames, i), retrieveLOName( pNtk, pAig, pAigNew, pObj, vLive, vFair ) ) == 0 );
#endif    
#endif
        
    return 0;

}